

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O0

CURLcode get_url_file_name(GlobalConfig *global,char **filename,char *url)

{
  char *pcVar1;
  char *local_58;
  char *pc2;
  char *pc;
  int i;
  CURLUcode uerr;
  char *path;
  CURLU *uh;
  char *url_local;
  char **filename_local;
  GlobalConfig *global_local;
  
  uh = (CURLU *)url;
  url_local = (char *)filename;
  filename_local = (char **)global;
  path = (char *)curl_url();
  _i = (char *)0x0;
  if (path == (char *)0x0) {
    global_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    url_local[0] = '\0';
    url_local[1] = '\0';
    url_local[2] = '\0';
    url_local[3] = '\0';
    url_local[4] = '\0';
    url_local[5] = '\0';
    url_local[6] = '\0';
    url_local[7] = '\0';
    pc._4_4_ = curl_url_set(path,0,uh,0x200);
    if (pc._4_4_ == CURLUE_OK) {
      pc._4_4_ = curl_url_get(path,7,&i,0);
      curl_url_cleanup(path);
      path = (char *)0x0;
      if (pc._4_4_ == CURLUE_OK) {
        pc2 = (char *)0x0;
        for (pc._0_4_ = 0; (int)pc < 2; pc._0_4_ = (int)pc + 1) {
          pc2 = strrchr(_i,0x2f);
          if (pc2 == (char *)0x0) {
            local_58 = _i;
          }
          else {
            local_58 = pc2 + 1;
          }
          pcVar1 = strrchr(local_58,0x5c);
          if (pcVar1 != (char *)0x0) {
            pc2 = pcVar1;
          }
          if (((pc2 != (char *)0x0) && (pc2[1] == '\0')) && ((int)pc == 0)) {
            *pc2 = '\0';
          }
        }
        if (pc2 == (char *)0x0) {
          pc2 = "curl_response";
          warnf((GlobalConfig *)filename_local,"No remote file name, uses \"%s\"","curl_response");
        }
        else {
          pc2 = pc2 + 1;
        }
        pcVar1 = strdup(pc2);
        *(char **)url_local = pcVar1;
        curl_free(_i);
        if (*(long *)url_local == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        return CURLE_OK;
      }
    }
    curl_url_cleanup(path);
    global_local._4_4_ = urlerr_cvt(pc._4_4_);
  }
  return global_local._4_4_;
}

Assistant:

CURLcode get_url_file_name(struct GlobalConfig *global,
                           char **filename, const char *url)
{
  CURLU *uh = curl_url();
  char *path = NULL;
  CURLUcode uerr;

  if(!uh)
    return CURLE_OUT_OF_MEMORY;

  *filename = NULL;

  uerr = curl_url_set(uh, CURLUPART_URL, url, CURLU_GUESS_SCHEME);
  if(!uerr) {
    uerr = curl_url_get(uh, CURLUPART_PATH, &path, 0);
    curl_url_cleanup(uh);
    uh = NULL;
    if(!uerr) {
      int i;
      char *pc = NULL, *pc2 = NULL;
      for(i = 0; i < 2; i++) {
        pc = strrchr(path, '/');
        pc2 = strrchr(pc ? pc + 1 : path, '\\');
        if(pc2)
          pc = pc2;
        if(pc && !pc[1] && !i) {
          /* if the path ends with slash, try removing the trailing one
             and get the last directory part */
          *pc = 0;
        }
      }

      if(pc)
        /* duplicate the string beyond the slash */
        pc++;
      else {
        /* no slash => empty string, use default */
        pc = (char *)"curl_response";
        warnf(global, "No remote file name, uses \"%s\"", pc);
      }

      *filename = strdup(pc);
      curl_free(path);
      if(!*filename)
        return CURLE_OUT_OF_MEMORY;

#if defined(_WIN32) || defined(MSDOS)
      {
        char *sanitized;
        SANITIZEcode sc = sanitize_file_name(&sanitized, *filename, 0);
        Curl_safefree(*filename);
        if(sc) {
          if(sc == SANITIZE_ERR_OUT_OF_MEMORY)
            return CURLE_OUT_OF_MEMORY;
          return CURLE_URL_MALFORMAT;
        }
        *filename = sanitized;
      }
#endif /* _WIN32 || MSDOS */

      /* in case we built debug enabled, we allow an environment variable
       * named CURL_TESTDIR to prefix the given filename to put it into a
       * specific directory
       */
#ifdef DEBUGBUILD
      {
        char *tdir = curl_getenv("CURL_TESTDIR");
        if(tdir) {
          char *alt = aprintf("%s/%s", tdir, *filename);
          Curl_safefree(*filename);
          *filename = alt;
          curl_free(tdir);
          if(!*filename)
            return CURLE_OUT_OF_MEMORY;
        }
      }
#endif
      return CURLE_OK;
    }
  }
  curl_url_cleanup(uh);
  return urlerr_cvt(uerr);
}